

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

RBFTransactionState IsRBFOptIn(CTransaction *tx,CTxMemPool *pool)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  CTxMemPoolEntry *pCVar6;
  CTxMemPoolEntry **ppCVar7;
  _Rb_tree_node_base *p_Var8;
  RBFTransactionState RVar9;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  Limits local_78;
  setEntries ancestors;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = SignalsOptInRBF(tx);
  if (bVar5) {
    RVar9 = REPLACEABLE_BIP125;
  }
  else {
    ancestors._M_t._M_impl._0_1_ = 0;
    uVar2 = *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._1_8_ =
         *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    uVar3 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar4 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    ancestors._M_t._M_impl._1_7_ = SUB87(uVar2,0);
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
         (undefined1)((ulong)uVar2 >> 0x38);
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = (undefined7)uVar3;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         (undefined1)((ulong)uVar3 >> 0x38);
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = (undefined7)uVar4;
    ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
         (undefined1)((ulong)uVar4 >> 0x38);
    bVar5 = CTxMemPool::exists(pool,(GenTxid *)&ancestors);
    RVar9 = UNKNOWN;
    if (bVar5) {
      pCVar6 = CTxMemPool::GetEntry(pool,&tx->hash);
      ancestors._M_t._M_impl._0_1_ = SUB81(pCVar6,0);
      ancestors._M_t._M_impl._1_7_ = SUB87((ulong)pCVar6 >> 8,0);
      ppCVar7 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                          ((CTxMemPoolEntry **)&ancestors,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/rbf.cpp"
                           ,0x29,"IsRBFOptIn","pool.GetEntry(tx.GetHash())");
      local_78.ancestor_count = 0x7fffffffffffffff;
      local_78.ancestor_size_vbytes = 0x7fffffffffffffff;
      local_78.descendant_count = 0x7fffffffffffffff;
      local_78.descendant_size_vbytes = 0x7fffffffffffffff;
      calling_fn_name._M_str = "IsRBFOptIn";
      calling_fn_name._M_len = 10;
      CTxMemPool::AssumeCalculateMemPoolAncestors
                (&ancestors,pool,calling_fn_name,*ppCVar7,&local_78,false);
      RVar9 = FINAL;
      for (p_Var8 = (_Rb_tree_node_base *)
                    CONCAT71(ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_,
                             ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_);
          (_Rb_tree_header *)p_Var8 != &ancestors._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        bVar5 = SignalsOptInRBF((CTransaction *)**(undefined8 **)(p_Var8 + 1));
        if (bVar5) {
          RVar9 = REPLACEABLE_BIP125;
          break;
        }
      }
      std::_Rb_tree<$270907ca$>::~_Rb_tree(&ancestors._M_t);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar9;
  }
  __stack_chk_fail();
}

Assistant:

RBFTransactionState IsRBFOptIn(const CTransaction& tx, const CTxMemPool& pool)
{
    AssertLockHeld(pool.cs);

    // First check the transaction itself.
    if (SignalsOptInRBF(tx)) {
        return RBFTransactionState::REPLACEABLE_BIP125;
    }

    // If this transaction is not in our mempool, then we can't be sure
    // we will know about all its inputs.
    if (!pool.exists(GenTxid::Txid(tx.GetHash()))) {
        return RBFTransactionState::UNKNOWN;
    }

    // If all the inputs have nSequence >= maxint-1, it still might be
    // signaled for RBF if any unconfirmed parents have signaled.
    const auto& entry{*Assert(pool.GetEntry(tx.GetHash()))};
    auto ancestors{pool.AssumeCalculateMemPoolAncestors(__func__, entry, CTxMemPool::Limits::NoLimits(),
                                                        /*fSearchForParents=*/false)};

    for (CTxMemPool::txiter it : ancestors) {
        if (SignalsOptInRBF(it->GetTx())) {
            return RBFTransactionState::REPLACEABLE_BIP125;
        }
    }
    return RBFTransactionState::FINAL;
}